

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkeletonReader.cpp
# Opt level: O1

StepStatus __thiscall
adios2::core::engine::SkeletonReader::BeginStep
          (SkeletonReader *this,StepMode mode,float timeoutSeconds)

{
  StepStatus SVar1;
  ostream *poVar2;
  
  this->m_CurrentStep = this->m_CurrentStep + 1;
  if (this->m_Verbosity == 5) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Skeleton Reader ",0x10);
    poVar2 = (ostream *)std::ostream::operator<<(&std::cout,this->m_ReaderRank);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"   BeginStep() new step ",0x18);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_CurrentStep);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  }
  SVar1 = OK;
  if (this->m_CurrentStep == 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Skeleton Reader ",0x10);
    poVar2 = (ostream *)std::ostream::operator<<(&std::cout,this->m_ReaderRank);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,"   forcefully returns End of Stream at this step\n",0x31);
    SVar1 = EndOfStream;
  }
  return SVar1;
}

Assistant:

StepStatus SkeletonReader::BeginStep(const StepMode mode, const float timeoutSeconds)
{
    // step info should be received from the writer side in BeginStep()
    // so this forced increase should not be here
    ++m_CurrentStep;

    if (m_Verbosity == 5)
    {
        std::cout << "Skeleton Reader " << m_ReaderRank << "   BeginStep() new step "
                  << m_CurrentStep << "\n";
    }

    // If we reach the end of stream (writer is gone or explicitly tells the
    // reader)
    // we return EndOfStream to the reader application
    if (m_CurrentStep == 2)
    {
        std::cout << "Skeleton Reader " << m_ReaderRank
                  << "   forcefully returns End of Stream at this step\n";

        return StepStatus::EndOfStream;
    }

    // We should block until a new step arrives or reach the timeout

    // m_IO Variables and Attributes should be defined at this point
    // so that the application can inquire them and start getting data

    return StepStatus::OK;
}